

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiImageClearingTests.cpp
# Opt level: O1

void __thiscall
vkt::api::anon_unknown_0::ImageClearingTestInstance::ImageClearingTestInstance
          (ImageClearingTestInstance *this,Context *context,TestParams_conflict *params)

{
  VkFormat VVar1;
  uint uVar2;
  undefined4 uVar3;
  VkImage image;
  deUint64 dVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  VkCommandPool VVar12;
  Handle<(vk::HandleType)17> HVar13;
  VkAllocationCallbacks *pVVar14;
  deUint32 dVar15;
  VkImageUsageFlags VVar16;
  int iVar17;
  uint uVar18;
  VkResult result;
  VkDevice pVVar19;
  InstanceInterface *pIVar20;
  DeviceInterface *pDVar21;
  VkQueue pVVar22;
  Allocator *pAVar23;
  VkPhysicalDevice pVVar24;
  TextureFormat TVar25;
  NotSupportedError *this_00;
  VkAttachmentReference *pVVar26;
  uint uVar27;
  VkAttachmentReference *pVVar28;
  bool bVar29;
  float fVar30;
  VkFormatProperties VVar31;
  VkAttachmentReference attachmentRef;
  undefined1 local_128 [16];
  VkDevice local_118;
  VkCommandPool VStack_110;
  deUint32 local_108;
  VkSubpassDescription *local_100;
  deUint32 local_f8;
  VkSubpassDependency *local_f0;
  VkSubpassDescription subpassDesc [1];
  VkImageView attachmentViews [1];
  Move<vk::Handle<(vk::HandleType)17>_> local_58;
  
  (this->super_TestInstance).m_context = context;
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__ImageClearingTestInstance_00d1f790;
  this->m_params = params;
  pVVar19 = Context::getDevice(context);
  this->m_device = pVVar19;
  pIVar20 = Context::getInstanceInterface(context);
  this->m_vki = pIVar20;
  pDVar21 = Context::getDeviceInterface(context);
  this->m_vkd = pDVar21;
  pVVar22 = Context::getUniversalQueue(context);
  this->m_queue = pVVar22;
  dVar15 = Context::getUniversalQueueFamilyIndex(context);
  this->m_queueFamilyIndex = dVar15;
  pAVar23 = Context::getDefaultAllocator(context);
  this->m_allocator = pAVar23;
  VVar1 = params->imageFormat;
  pIVar20 = this->m_vki;
  pVVar24 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  VVar31 = ::vk::getPhysicalDeviceFormatProperties(pIVar20,pVVar24,VVar1);
  bVar29 = ((undefined1  [12])VVar31 & (undefined1  [12])0x28000000000) == (undefined1  [12])0x0;
  this->m_isAttachmentFormat = !bVar29;
  if (bVar29) {
    VVar16 = 3;
  }
  else {
    bVar29 = ::vk::isDepthStencilFormat(params->imageFormat);
    VVar16 = (uint)bVar29 * 0x10 + 0x13;
  }
  this->m_imageUsageFlags = VVar16;
  VVar1 = params->imageFormat;
  TVar25 = ::vk::mapVkFormat(VVar1);
  bVar29 = (TVar25.order - D & 0xfffffffd) == 0;
  TVar25 = ::vk::mapVkFormat(VVar1);
  iVar17 = bVar29 + 4 + (uint)bVar29;
  if (1 < TVar25.order - S) {
    iVar17 = (uint)bVar29 * 2;
  }
  this->m_imageAspectFlags = iVar17 + (uint)(iVar17 == 0);
  pIVar20 = this->m_vki;
  pVVar24 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  iVar17 = (*pIVar20->_vptr_InstanceInterface[4])
                     (pIVar20,pVVar24,(ulong)this->m_params->imageFormat,
                      (ulong)this->m_params->imageType,0,(ulong)this->m_imageUsageFlags,0,
                      &this->m_imageFormatProperties);
  if (iVar17 != -0xb) {
    uVar18 = 1;
    if (params->useSingleMipLevel == false) {
      uVar18 = (params->imageExtent).width;
      uVar27 = (params->imageExtent).height;
      if (uVar27 < uVar18) {
        uVar27 = uVar18;
      }
      uVar18 = (params->imageExtent).depth;
      if (uVar27 <= uVar18) {
        uVar27 = uVar18;
      }
      uVar2 = (this->m_imageFormatProperties).maxMipLevels;
      fVar30 = logf((float)uVar27);
      uVar18 = (int)(long)(fVar30 * 1.442695) + 1;
      if (uVar2 <= uVar18) {
        uVar18 = uVar2;
      }
    }
    this->m_imageMipLevels = uVar18;
    uVar27 = 1;
    if (1 < uVar18) {
      uVar27 = uVar18 >> 1;
    }
    this->m_thresholdMipLevel = uVar27;
    ::vk::createCommandPool
              ((Move<vk::Handle<(vk::HandleType)24>_> *)local_128,this->m_vkd,this->m_device,2,
               this->m_queueFamilyIndex,(VkAllocationCallbacks *)0x0);
    VVar12.m_internal = VStack_110.m_internal;
    pVVar19 = local_118;
    uVar11 = local_128._8_8_;
    uVar10 = local_128._0_8_;
    subpassDesc[0].pInputAttachments._0_4_ = SUB84(local_118,0);
    subpassDesc[0].pInputAttachments._4_4_ = (undefined4)((ulong)local_118 >> 0x20);
    subpassDesc[0].colorAttachmentCount = (deUint32)VStack_110.m_internal;
    subpassDesc[0]._28_4_ = (undefined4)(VStack_110.m_internal >> 0x20);
    subpassDesc[0].flags = local_128._0_4_;
    subpassDesc[0].pipelineBindPoint = local_128._4_4_;
    subpassDesc[0]._8_8_ = local_128._8_8_;
    local_128._0_8_ = (VkCommandBuffer_s *)0x0;
    local_128._8_8_ = (DeviceInterface *)0x0;
    local_118 = (VkDevice)0x0;
    VStack_110.m_internal = 0;
    (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
         pVVar19;
    (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator
         = (VkAllocationCallbacks *)VVar12.m_internal;
    (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
         uVar10;
    (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)uVar11;
    ::vk::allocateCommandBuffer
              ((Move<vk::VkCommandBuffer_s_*> *)local_128,this->m_vkd,this->m_device,
               (VkCommandPool)
               (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
               m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
    VVar12.m_internal = VStack_110.m_internal;
    pVVar19 = local_118;
    uVar11 = local_128._8_8_;
    uVar10 = local_128._0_8_;
    local_128._0_8_ = 0;
    local_128._8_8_ = (DeviceInterface *)0x0;
    local_118 = (VkDevice)0x0;
    VStack_110.m_internal = 0;
    (this->m_commandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device = pVVar19
    ;
    (this->m_commandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal
         = VVar12.m_internal;
    (this->m_commandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
         (VkCommandBuffer_s *)uVar10;
    (this->m_commandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)uVar11;
    uVar6 = params->imageType;
    uVar7 = params->imageFormat;
    uVar8 = (params->imageExtent).width;
    uVar9 = (params->imageExtent).height;
    subpassDesc[0].pColorAttachments._4_4_ = (params->imageExtent).depth;
    subpassDesc[0].preserveAttachmentCount = this->m_imageUsageFlags;
    subpassDesc[0].pipelineBindPoint = SUB84(uVar10,4);
    subpassDesc[0].flags = 0xe;
    subpassDesc[0].inputAttachmentCount = 0;
    subpassDesc[0]._12_4_ = 0;
    subpassDesc[0].pInputAttachments._0_4_ = 0;
    subpassDesc[0].pResolveAttachments._0_4_ = this->m_imageMipLevels;
    subpassDesc[0].pResolveAttachments._4_4_ = 1;
    subpassDesc[0].pDepthStencilAttachment._0_4_ = 1;
    subpassDesc[0].pDepthStencilAttachment._4_4_ = 0;
    subpassDesc[0]._60_4_ = 0;
    subpassDesc[0].pPreserveAttachments._0_4_ = 1;
    subpassDesc[0].pInputAttachments._4_4_ = uVar6;
    subpassDesc[0].colorAttachmentCount = uVar7;
    subpassDesc[0]._28_4_ = uVar8;
    subpassDesc[0].pColorAttachments._0_4_ = uVar9;
    ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)local_128,this->m_vkd,this->m_device,
                      (VkImageCreateInfo *)subpassDesc,(VkAllocationCallbacks *)0x0);
    VVar12.m_internal = VStack_110.m_internal;
    pVVar19 = local_118;
    uVar11 = local_128._8_8_;
    uVar10 = local_128._0_8_;
    subpassDesc[0].pInputAttachments._0_4_ = SUB84(local_118,0);
    subpassDesc[0].pInputAttachments._4_4_ = (undefined4)((ulong)local_118 >> 0x20);
    subpassDesc[0].colorAttachmentCount = (deUint32)VStack_110.m_internal;
    subpassDesc[0]._28_4_ = (undefined4)(VStack_110.m_internal >> 0x20);
    subpassDesc[0].flags = local_128._0_4_;
    subpassDesc[0].pipelineBindPoint = local_128._4_4_;
    subpassDesc[0]._8_8_ = local_128._8_8_;
    local_128._0_8_ = 0;
    local_128._8_8_ = (DeviceInterface *)0x0;
    local_118 = (VkDevice)0x0;
    VStack_110.m_internal = 0;
    (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device = pVVar19;
    (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)VVar12.m_internal;
    (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = uVar10;
    (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)uVar11;
    pAVar23 = this->m_allocator;
    image.m_internal =
         (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
    ::vk::getImageMemoryRequirements
              ((VkMemoryRequirements *)subpassDesc,this->m_vkd,this->m_device,image);
    (*pAVar23->_vptr_Allocator[3])(&this->m_imageMemory,pAVar23,subpassDesc,0);
    result = (*this->m_vkd->_vptr_DeviceInterface[0xd])
                       (this->m_vkd,this->m_device,image.m_internal,
                        (((this->m_imageMemory).
                          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                          m_data.ptr)->m_memory).m_internal);
    ::vk::checkResult(result,
                      "m_vkd.bindImageMemory(m_device, image, imageMemory->getMemory(), imageMemory->getOffset())"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiImageClearingTests.cpp"
                      ,0x1fe);
    if (this->m_isAttachmentFormat == true) {
      dVar4 = (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal
      ;
      subpassDesc[0].pColorAttachments._0_4_ = VK_IMAGE_TYPE_2D;
      if (params->imageType < VK_IMAGE_TYPE_LAST) {
        subpassDesc[0].pColorAttachments._0_4_ = params->imageType;
      }
      subpassDesc[0].pColorAttachments._4_4_ = params->imageFormat;
      subpassDesc[0].preserveAttachmentCount = this->m_imageAspectFlags;
      subpassDesc[0].flags = 0xf;
      subpassDesc[0].inputAttachmentCount = 0;
      subpassDesc[0]._12_4_ = 0;
      subpassDesc[0].pInputAttachments._0_4_ = 0;
      subpassDesc[0].colorAttachmentCount = (deUint32)dVar4;
      subpassDesc[0]._28_4_ = (undefined4)(dVar4 >> 0x20);
      subpassDesc[0].pResolveAttachments._0_4_ = 0;
      subpassDesc[0].pResolveAttachments._4_4_ = 0;
      subpassDesc[0].pDepthStencilAttachment._0_4_ = 0;
      subpassDesc[0].pDepthStencilAttachment._4_4_ = 0;
      subpassDesc[0]._60_4_ = 0;
      subpassDesc[0].pPreserveAttachments._0_4_ = 1;
      subpassDesc[0].pPreserveAttachments._4_4_ = 0;
      ::vk::createImageView
                ((Move<vk::Handle<(vk::HandleType)13>_> *)local_128,this->m_vkd,this->m_device,
                 (VkImageViewCreateInfo *)subpassDesc,(VkAllocationCallbacks *)0x0);
    }
    else {
      local_118 = (VkDevice)0x0;
      VStack_110.m_internal = 0;
      local_128._0_8_ = 0;
      local_128._8_8_ = (DeviceInterface *)0x0;
    }
    VVar12.m_internal = VStack_110.m_internal;
    pVVar19 = local_118;
    uVar11 = local_128._8_8_;
    uVar10 = local_128._0_8_;
    subpassDesc[0].pInputAttachments._0_4_ = SUB84(local_118,0);
    subpassDesc[0].pInputAttachments._4_4_ = (undefined4)((ulong)local_118 >> 0x20);
    subpassDesc[0].colorAttachmentCount = (deUint32)VStack_110.m_internal;
    subpassDesc[0]._28_4_ = (undefined4)(VStack_110.m_internal >> 0x20);
    subpassDesc[0].flags = local_128._0_4_;
    subpassDesc[0].pipelineBindPoint = local_128._4_4_;
    subpassDesc[0]._8_8_ = local_128._8_8_;
    local_128._0_8_ = 0;
    local_128._8_8_ = (DeviceInterface *)0x0;
    local_118 = (VkDevice)0x0;
    VStack_110.m_internal = 0;
    (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
         pVVar19;
    (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)VVar12.m_internal;
    (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal =
         uVar10;
    (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface
         = (DeviceInterface *)uVar11;
    if (this->m_isAttachmentFormat == true) {
      VVar1 = params->imageFormat;
      bVar29 = ::vk::isDepthStencilFormat(VVar1);
      attachmentRef.layout = bVar29 | VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
      pVVar28 = (VkAttachmentReference *)0x0;
      attachmentViews[0].m_internal = (VkImageView)((ulong)VVar1 << 0x20);
      attachmentRef.attachment = 0;
      bVar29 = ::vk::isDepthStencilFormat(VVar1);
      pVVar26 = &attachmentRef;
      if (!bVar29) {
        pVVar26 = pVVar28;
        pVVar28 = &attachmentRef;
      }
      subpassDesc[0].flags = 0;
      subpassDesc[0].pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
      subpassDesc[0]._8_8_ = subpassDesc[0]._8_8_ & 0xffffffff00000000;
      subpassDesc[0].pInputAttachments._0_4_ = 0;
      subpassDesc[0].pInputAttachments._4_4_ = 0;
      subpassDesc[0].colorAttachmentCount = (deUint32)!bVar29;
      subpassDesc[0].pColorAttachments._0_4_ = (VkImageType)pVVar28;
      subpassDesc[0].pColorAttachments._4_4_ = (VkFormat)((ulong)pVVar28 >> 0x20);
      subpassDesc[0].pResolveAttachments._0_4_ = 0;
      subpassDesc[0].pResolveAttachments._4_4_ = 0;
      subpassDesc[0].pDepthStencilAttachment._0_4_ = SUB84(pVVar26,0);
      subpassDesc[0].pDepthStencilAttachment._4_4_ = (undefined4)((ulong)pVVar26 >> 0x20);
      subpassDesc[0].preserveAttachmentCount = 0;
      subpassDesc[0].pPreserveAttachments._0_4_ = 0;
      subpassDesc[0].pPreserveAttachments._4_4_ = 0;
      local_128._0_4_ = 0x26;
      local_128._8_8_ = (DeviceInterface *)0x0;
      local_118 = (VkDevice)0x100000000;
      VStack_110.m_internal = (deUint64)attachmentViews;
      local_108 = 1;
      local_100 = subpassDesc;
      local_f8 = 0;
      local_f0 = (VkSubpassDependency *)0x0;
      ::vk::createRenderPass
                (&local_58,this->m_vkd,this->m_device,(VkRenderPassCreateInfo *)local_128,
                 (VkAllocationCallbacks *)0x0);
    }
    else {
      local_58.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      local_58.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      local_58.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal = 0;
      local_58.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
    }
    pVVar14 = local_58.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator;
    pVVar19 = local_58.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device;
    pDVar21 = local_58.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface;
    HVar13.m_internal =
         local_58.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
    subpassDesc[0].pInputAttachments._4_4_ =
         (undefined4)
         ((ulong)local_58.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device >>
         0x20);
    local_58.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal = 0;
    local_58.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_58.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device = (VkDevice)0x0;
    local_58.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
         pVVar19;
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
         pVVar14;
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal =
         HVar13.m_internal;
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface
         = pDVar21;
    if (this->m_isAttachmentFormat == true) {
      attachmentViews[0].m_internal =
           (VkImageView)
           (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
           m_internal;
      dVar4 = (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
              m_internal;
      uVar3 = (params->imageExtent).width;
      uVar5 = (params->imageExtent).height;
      subpassDesc[0].pResolveAttachments = (VkAttachmentReference *)attachmentViews;
      subpassDesc[0].pipelineBindPoint = (VkPipelineBindPoint)(HVar13.m_internal >> 0x20);
      subpassDesc[0].flags = 0x25;
      subpassDesc[0].inputAttachmentCount = 0;
      subpassDesc[0]._12_4_ = 0;
      subpassDesc[0].pInputAttachments._0_4_ = 0;
      subpassDesc[0].colorAttachmentCount = (deUint32)dVar4;
      subpassDesc[0]._28_4_ = (undefined4)(dVar4 >> 0x20);
      subpassDesc[0].pColorAttachments._0_4_ = 1;
      subpassDesc[0].preserveAttachmentCount = 1;
      subpassDesc[0].pDepthStencilAttachment._0_4_ = uVar3;
      subpassDesc[0].pDepthStencilAttachment._4_4_ = uVar5;
      ::vk::createFramebuffer
                ((Move<vk::Handle<(vk::HandleType)23>_> *)local_128,this->m_vkd,this->m_device,
                 (VkFramebufferCreateInfo *)subpassDesc,(VkAllocationCallbacks *)0x0);
    }
    else {
      local_118 = (VkDevice)0x0;
      VStack_110.m_internal = 0;
      local_128._0_8_ = 0;
      local_128._8_8_ = (DeviceInterface *)0x0;
    }
    (this->m_frameBuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
         local_118;
    (this->m_frameBuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator
         = (VkAllocationCallbacks *)VStack_110.m_internal;
    (this->m_frameBuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
         local_128._0_8_;
    (this->m_frameBuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)local_128._8_8_;
    return;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Format not supported",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiImageClearingTests.cpp"
             ,0x1f6);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

ImageClearingTestInstance::ImageClearingTestInstance (Context& context, const TestParams& params)
	: TestInstance				(context)
	, m_params					(params)
	, m_device					(context.getDevice())
	, m_vki						(context.getInstanceInterface())
	, m_vkd						(context.getDeviceInterface())
	, m_queue					(context.getUniversalQueue())
	, m_queueFamilyIndex		(context.getUniversalQueueFamilyIndex())
	, m_allocator				(context.getDefaultAllocator())
	, m_isAttachmentFormat		(getIsAttachmentFormat(params.imageFormat))
	, m_imageUsageFlags			(getImageUsageFlags(params.imageFormat))
	, m_imageAspectFlags		(getImageAspectFlags(params.imageFormat))
	, m_imageFormatProperties	(getImageFormatProperties())
	, m_imageMipLevels			(params.useSingleMipLevel ? 1u : getNumMipLevels(params.imageExtent, m_imageFormatProperties.maxMipLevels))
	, m_thresholdMipLevel		(std::max(m_imageMipLevels / 2u, 1u))
	, m_commandPool				(createCommandPool(VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT))
	, m_commandBuffer			(allocatePrimaryCommandBuffer(*m_commandPool))

	, m_image					(createImage(params.imageType,
											 params.imageFormat,
											 params.imageExtent,
											 m_imageUsageFlags))

	, m_imageMemory				(allocateAndBindImageMemory(*m_image))
	, m_imageView				(m_isAttachmentFormat ? createImageView(*m_image,
												 getCorrespondingImageViewType(params.imageType),
												 params.imageFormat,
												 m_imageAspectFlags) : vk::Move<VkImageView>())

	, m_renderPass				(m_isAttachmentFormat ? createRenderPass(params.imageFormat) : vk::Move<vk::VkRenderPass>())
	, m_frameBuffer				(m_isAttachmentFormat ? createFrameBuffer(*m_imageView, *m_renderPass, params.imageExtent.width, params.imageExtent.height) : vk::Move<vk::VkFramebuffer>())
{
}